

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Detonation_PDU::Detonation_PDU(Detonation_PDU *this,KDataStream *stream)

{
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_00224368;
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_LocationWorldCoords);
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002243c0;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  DATA_TYPE::Vector::Vector(&this->m_LocationEntityCoords);
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}